

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O2

void SIGINT_exit(int param_1)

{
  putchar(10);
  puts("c *** INTERRUPTED ***");
  if (0 < *(int *)(solver + 0x34)) {
    (**(code **)(*(long *)solver + 0x18))();
    puts("c");
    puts("c *** INTERRUPTED ***");
  }
  _exit(1);
}

Assistant:

static void SIGINT_exit(int)
{
    printf("\n");
    printf("c *** INTERRUPTED ***\n");
    if (solver->verbosity > 0) {
        printStats(*solver);
        printf("c\n");
        printf("c *** INTERRUPTED ***\n");
    }
    _exit(1);
}